

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

zlib_table * zlib_mkonetab(int *codes,uchar *lengths,int nsyms,int pfx,int pfxbits,int bits)

{
  zlib_table *pzVar1;
  zlib_tableentry *pzVar2;
  zlib_table *pzVar3;
  byte bVar4;
  byte bVar5;
  int local_44;
  uint local_40;
  int code;
  int j;
  int i;
  int nbits;
  int pfxmask;
  zlib_table *tab;
  int bits_local;
  int pfxbits_local;
  int pfx_local;
  int nsyms_local;
  uchar *lengths_local;
  int *codes_local;
  
  pzVar1 = (zlib_table *)safemalloc(1,0x10,0);
  bVar4 = (byte)pfxbits;
  bVar5 = (byte)bits;
  pzVar2 = (zlib_tableentry *)safemalloc(1L << (bVar5 & 0x3f),0x10,0);
  pzVar1->table = pzVar2;
  pzVar1->mask = (1 << (bVar5 & 0x1f)) + -1;
  for (local_44 = 0; local_44 <= pzVar1->mask; local_44 = local_44 + 1) {
    pzVar1->table[local_44].code = -1;
    pzVar1->table[local_44].nbits = '\0';
    pzVar1->table[local_44].nexttable = (zlib_table *)0x0;
  }
  for (code = 0; code < nsyms; code = code + 1) {
    if ((pfxbits < (int)(uint)lengths[code]) && ((codes[code] & (1 << (bVar4 & 0x1f)) - 1U) == pfx))
    {
      for (local_40 = codes[code] >> (bVar4 & 0x1f) & pzVar1->mask; (int)local_40 <= pzVar1->mask;
          local_40 = (1 << (lengths[code] - bVar4 & 0x1f)) + local_40) {
        pzVar1->table[(int)local_40].code = (short)code;
        if ((int)(uint)pzVar1->table[(int)local_40].nbits < (int)((uint)lengths[code] - pfxbits)) {
          pzVar1->table[(int)local_40].nbits = (uchar)((uint)lengths[code] - pfxbits);
        }
      }
    }
  }
  for (local_44 = 0; local_44 <= pzVar1->mask; local_44 = local_44 + 1) {
    if (bits < (int)(uint)pzVar1->table[local_44].nbits) {
      pzVar1->table[local_44].code = -1;
      j = (uint)pzVar1->table[local_44].nbits - bits;
      if (7 < j) {
        j = 7;
      }
      pzVar1->table[local_44].nbits = bVar5;
      pzVar3 = zlib_mkonetab(codes,lengths,nsyms,pfx | local_44 << (bVar4 & 0x1f),pfxbits + bits,j);
      pzVar1->table[local_44].nexttable = pzVar3;
    }
  }
  return pzVar1;
}

Assistant:

static struct zlib_table *zlib_mkonetab(int *codes, unsigned char *lengths,
                                        int nsyms,
                                        int pfx, int pfxbits, int bits)
{
    struct zlib_table *tab = snew(struct zlib_table);
    int pfxmask = (1 << pfxbits) - 1;
    int nbits, i, j, code;

    tab->table = snewn((size_t)1 << bits, struct zlib_tableentry);
    tab->mask = (1 << bits) - 1;

    for (code = 0; code <= tab->mask; code++) {
        tab->table[code].code = -1;
        tab->table[code].nbits = 0;
        tab->table[code].nexttable = NULL;
    }

    for (i = 0; i < nsyms; i++) {
        if (lengths[i] <= pfxbits || (codes[i] & pfxmask) != pfx)
            continue;
        code = (codes[i] >> pfxbits) & tab->mask;
        for (j = code; j <= tab->mask; j += 1 << (lengths[i] - pfxbits)) {
            tab->table[j].code = i;
            nbits = lengths[i] - pfxbits;
            if (tab->table[j].nbits < nbits)
                tab->table[j].nbits = nbits;
        }
    }
    for (code = 0; code <= tab->mask; code++) {
        if (tab->table[code].nbits <= bits)
            continue;
        /* Generate a subtable. */
        tab->table[code].code = -1;
        nbits = tab->table[code].nbits - bits;
        if (nbits > 7)
            nbits = 7;
        tab->table[code].nbits = bits;
        tab->table[code].nexttable = zlib_mkonetab(codes, lengths, nsyms,
                                                   pfx | (code << pfxbits),
                                                   pfxbits + bits, nbits);
    }

    return tab;
}